

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O2

Node * __thiscall BPTree::search(BPTree *this,float x,bool flag,bool printer)

{
  uint uVar1;
  float fVar2;
  Node *pNVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  int j_2;
  int j;
  long lVar8;
  long lVar9;
  
LAB_0011919b:
  do {
    pNVar3 = this->root;
LAB_001191a1:
    if (pNVar3->IS_LEAF != false) {
      if (printer) {
        lVar6 = 0;
        for (lVar8 = 0; lVar8 < pNVar3->size; lVar8 = lVar8 + 1) {
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              *(float *)((long)&pNVar3->key->key_value + lVar6));
          std::operator<<(poVar5," ");
          lVar6 = lVar6 + 0x20;
        }
        std::operator<<((ostream *)&std::cout,"\n");
      }
      uVar7 = (ulong)(uint)pNVar3->size;
      if (pNVar3->size < 1) {
        uVar7 = 0;
      }
      lVar6 = 0;
      do {
        lVar8 = lVar6;
        lVar6 = lVar8 + 0x20;
        if (uVar7 * 0x20 + 0x20 == lVar6) {
          return (Node *)0x0;
        }
        fVar2 = *(float *)((long)&pNVar3->key->key_value + lVar8);
      } while ((fVar2 != x) || (NAN(fVar2) || NAN(x)));
      if (flag) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Size: ");
        poVar5 = std::ostream::_M_insert<unsigned_long>
                           (poVar5,*(long *)((long)&(pNVar3->key->add_vect).
                                                                                                        
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + lVar8
                                            ) -
                                   *(long *)((long)&(pNVar3->key->add_vect).
                                                                                                        
                                                  super__Vector_base<void_*,_std::allocator<void_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar8)
                                   >> 3);
        std::operator<<(poVar5,"\n");
        printf("Number of Data Blocks: %d",
               *(long *)((long)&(pNVar3->key->add_vect).
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_finish + lVar8) -
               *(long *)((long)&(pNVar3->key->add_vect).
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar8) >> 3);
        putchar(10);
      }
      return pNVar3;
    }
    uVar4 = pNVar3->size;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    uVar1 = uVar4 - 1;
    lVar6 = 0;
LAB_001191ca:
    if (uVar7 * 8 == lVar6) goto LAB_001191a1;
    if ((&pNVar3->key->key_value)[lVar6] <= x) {
      lVar6 = lVar6 + 8;
      if ((ulong)uVar1 * 8 + 8 != lVar6) goto LAB_001191ca;
      if (printer) {
        lVar6 = 0;
        for (lVar8 = 0; lVar8 < (int)uVar4; lVar8 = lVar8 + 1) {
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              *(float *)((long)&pNVar3->key->key_value + lVar6));
          std::operator<<(poVar5," ");
          uVar4 = pNVar3->size;
          lVar6 = lVar6 + 0x20;
        }
        std::operator<<((ostream *)&std::cout,"\n");
      }
      this = (BPTree *)(pNVar3->ptr + (ulong)uVar1 + 1);
      goto LAB_0011919b;
    }
    if (printer) {
      lVar8 = 0;
      for (lVar9 = 0; lVar9 < (int)uVar4; lVar9 = lVar9 + 1) {
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,*(float *)((long)&pNVar3->key->key_value + lVar8))
        ;
        std::operator<<(poVar5," ");
        uVar4 = pNVar3->size;
        lVar8 = lVar8 + 0x20;
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    this = (BPTree *)(lVar6 + (long)pNVar3->ptr);
  } while( true );
}

Assistant:

Node* search(float x, bool flag, bool printer)
    {
        //search logic
        if(root==NULL)
        {
            //empty
            //cout<<"Tree empty\n";
        }
        else
        {
            Node* cursor = root;
            //in the following while loop, cursor will travel to the leaf node possibly consisting the key
            while(cursor->IS_LEAF == false)
            {
                for(int i = 0; i < cursor->size; i++)
                {
                    if(x < cursor->key[i].key_value)
                    {
                        if (printer == true) {
                            for (int j = 0; j < cursor->size; j++) {
                                cout << cursor->key[j].key_value << " ";
                            }
                            cout << "\n";
                        }
                        cursor = cursor->ptr[i];
                        break;
                    }
                    if(i == cursor->size - 1)
                    {
                        if (printer == true) {
                            for (int j = 0; j < cursor->size; j++) {
                                cout << cursor->key[j].key_value << " ";
                            }
                            cout << "\n";
                        }
                        cursor = cursor->ptr[i+1];
                        break;
                    }
                }
            }
            //in the following for loop, we search for the key if it exists
            if (printer == true) {
                for (int j = 0; j < cursor->size; j++) {
                    cout << cursor->key[j].key_value << " ";
                }
                cout << "\n";
            }
            for(int i = 0; i < cursor->size; i++)
            {
                if(cursor->key[i].key_value == x)
                {
                    //cout<<"Found\n";
                    if (flag == true) {
                        cout <<"Size: "<< cursor->key[i].add_vect.size() << "\n";
                        printf("Number of Data Blocks: %d", cursor->key[i].add_vect.size());
                        printf("\n");
                        for (int j = 0; j < cursor->key[i].add_vect.size(); ++j) {
                            //printf("Data Block: ");
                            //printf("%p", (uchar *) cursor->key[i].add_vect[j]);
                            //printf("\n");
                            //printf("tconst: ");
                            //cout << (*(Record *) cursor->key[i].add_vect[j]).tconst << "\n";
                        }
                    }
                    return cursor;
                }
            }
            //cout<<"Not found\n";
            return nullptr;
        }
    }